

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.hpp
# Opt level: O1

bool commandExists(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                   *rules,string *input)

{
  size_t sVar1;
  size_t __n;
  bool bVar2;
  int iVar3;
  size_t *psVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  bool bVar8;
  _Rb_tree_node_base *local_48;
  
  local_48 = (rules->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    bVar8 = (_Rb_tree_header *)local_48 == &(rules->_M_t)._M_impl.super__Rb_tree_header;
    bVar2 = !bVar8;
    if (bVar8) {
      return bVar2;
    }
    lVar5 = (long)local_48[2]._M_parent - *(long *)(local_48 + 2);
    bVar8 = lVar5 != 0;
    if (bVar8) {
      uVar6 = lVar5 >> 5;
      sVar1 = input->_M_string_length;
      psVar4 = (size_t *)(*(long *)(local_48 + 2) + 8);
      uVar7 = 1;
      do {
        __n = *psVar4;
        if ((__n == sVar1) &&
           ((__n == 0 ||
            (iVar3 = bcmp((void *)psVar4[-1],(input->_M_dataplus)._M_p,__n), iVar3 == 0)))) {
          if (bVar8) {
            return bVar2;
          }
          break;
        }
        bVar8 = uVar7 < uVar6;
        psVar4 = psVar4 + 4;
        lVar5 = (-(ulong)(uVar6 == 0) - uVar6) + uVar7;
        uVar7 = uVar7 + 1;
      } while (lVar5 != 0);
    }
    local_48 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_48);
  } while( true );
}

Assistant:

bool commandExists(map<string, vector<string> > rules, string input) {
    for (map<string, vector<string> >::iterator it = rules.begin(); it != rules.end(); ++it) {
		for (int i = 0; i < it->second.size(); i++) {
			if (it->second[i] == input) {
				return true;
			}
		}
	}
	return false;
}